

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldd2bdd.c
# Opt level: O3

void run_CALL(WorkerP *w,Task *__dq_head)

{
  uint32_t uVar1;
  int *piVar2;
  char *__s;
  uint uVar3;
  double dVar4;
  FILE *pFVar5;
  FILE *mtbdd;
  FILE *pFVar6;
  size_t sVar7;
  void *__ptr;
  size_t sVar8;
  MTBDD MVar9;
  int iVar10;
  rel_t prVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  MDD MVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong __n;
  undefined1 *__ptr_00;
  undefined8 uStack_f0;
  undefined1 auStack_e8 [8];
  undefined1 local_e0 [8];
  MTBDD new_states;
  rel_t local_d0;
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *local_c8;
  MTBDD new_initial;
  MTBDD local_b8;
  MTBDD state_vars;
  FILE *local_a8;
  undefined1 local_a0 [8];
  MTBDD new_rel;
  FILE *local_90;
  int local_84;
  uint local_80;
  int has_reachable;
  int action_labels_count;
  undefined1 local_70 [8];
  uint32_t len;
  FILE *local_60;
  FILE *pFStack_58;
  undefined8 local_50;
  MDD local_48;
  
  puVar13 = auStack_e8;
  __ptr_00 = auStack_e8;
  uStack_f0 = 0x105319;
  pFVar6 = fopen(model_filename,"rb");
  puVar12 = auStack_e8;
  if (pFVar6 == (FILE *)0x0) goto LAB_00106051;
  uStack_f0 = 0x10533e;
  sVar7 = fread(&vector_size,4,1,pFVar6);
  puVar12 = auStack_e8;
  if (sVar7 != 1) goto LAB_00106056;
  if (verbose == '\x01') {
    uStack_f0 = 0x10535d;
    puts("Loading initial state.");
  }
  local_70 = (undefined1  [8])set_load_WRAP;
  _len = (_Worker *)0x1;
  uStack_f0 = 0x10537f;
  local_60 = pFVar6;
  lace_run_task((Task *)local_70);
  local_90 = local_60;
  uStack_f0 = 0x1053a3;
  sVar7 = fread(&next_count,4,1,pFVar6);
  iVar10 = next_count;
  puVar12 = auStack_e8;
  if (sVar7 != 1) goto LAB_0010605b;
  uStack_f0 = 0x1053c0;
  next = (rel_t *)malloc((long)next_count << 3);
  if (verbose == '\x01') {
    uStack_f0 = 0x1053dc;
    puts("Loading transition relations.");
    iVar10 = next_count;
  }
  if (0 < iVar10) {
    lVar17 = 0;
    do {
      local_70 = (undefined1  [8])rel_load_proj_WRAP;
      _len = (_Worker *)0x1;
      uStack_f0 = 0x105412;
      local_60 = pFVar6;
      lace_run_task((Task *)local_70);
      next[lVar17] = (rel_t)local_60;
      lVar17 = lVar17 + 1;
    } while (lVar17 < next_count);
    if (0 < next_count) {
      lVar17 = 0;
      do {
        pFStack_58 = (FILE *)next[lVar17];
        local_70 = (undefined1  [8])rel_load_WRAP;
        _len = (_Worker *)0x1;
        uStack_f0 = 0x105469;
        local_60 = pFVar6;
        lace_run_task((Task *)local_70);
        lVar17 = lVar17 + 1;
      } while (lVar17 < next_count);
    }
  }
  local_84 = 0;
  uStack_f0 = 0x105494;
  sVar7 = fread(&local_84,4,1,pFVar6);
  if (sVar7 != 1) goto LAB_00106060;
  puVar12 = auStack_e8;
  if (local_84 == 0) goto LAB_00106065;
  if (verbose == '\x01') {
    uStack_f0 = 0x1054bd;
    puts("Loading reachable states.");
  }
  local_70 = (undefined1  [8])set_load_WRAP;
  _len = (_Worker *)0x1;
  uStack_f0 = 0x1054d8;
  local_60 = pFVar6;
  lace_run_task((Task *)local_70);
  local_a8 = local_60;
  local_80 = 0;
  uStack_f0 = 0x1054ff;
  sVar7 = fread(&local_80,4,1,pFVar6);
  if (sVar7 == 1) {
    uVar20 = (ulong)local_80;
    lVar17 = -(uVar20 * 8 + 0xf & 0xfffffffffffffff0);
    __ptr_00 = auStack_e8 + lVar17;
    new_initial = (MTBDD)auStack_e8;
    state_vars = (MTBDD)__ptr_00;
    if (0 < (int)local_80) {
      uVar19 = 0;
      new_initial = (MTBDD)auStack_e8;
      do {
        *(undefined8 *)(auStack_e8 + lVar17 + -8) = 0x105555;
        sVar7 = fread(local_70,4,1,pFVar6);
        if (sVar7 != 1) {
LAB_00106047:
          *(undefined8 *)(auStack_e8 + lVar17 + -8) = 0x10604c;
          run_CALL_cold_4();
          goto LAB_0010604c;
        }
        __n = (ulong)local_70 & 0xffffffff;
        uVar15 = local_70._0_4_ + 1;
        *(undefined8 *)(auStack_e8 + lVar17 + -8) = 0x10556c;
        __ptr = malloc((ulong)uVar15);
        *(void **)(state_vars + uVar19 * 8) = __ptr;
        *(undefined8 *)(auStack_e8 + lVar17 + -8) = 0x10558d;
        sVar7 = fread(__ptr,1,__n,pFVar6);
        if (sVar7 != __n) {
          *(undefined8 *)(auStack_e8 + lVar17 + -8) = 0x106047;
          run_CALL_cold_5();
          goto LAB_00106047;
        }
        *(undefined1 *)((long)__ptr + __n) = 0;
        uVar19 = uVar19 + 1;
      } while (uVar20 != uVar19);
    }
  }
  else {
    local_80 = 0;
    state_vars = (MTBDD)&action_labels_count;
    new_initial = (MTBDD)auStack_e8;
  }
  *(undefined8 *)(__ptr_00 + -8) = 0x1055c6;
  fclose(pFVar6);
  *(undefined8 *)(__ptr_00 + -8) = 0x1055db;
  printf("Read file %s.\n");
  if (verbose != '\0') {
    *(undefined8 *)(__ptr_00 + -8) = 0x105602;
    printf("%d integers per state, %d transition groups\n",(ulong)(uint)vector_size,
           (ulong)(uint)next_count);
    *(undefined8 *)(__ptr_00 + -8) = 0x10560e;
    puts("LDD nodes:");
    MVar14 = *(MDD *)local_90;
    *(undefined8 *)(__ptr_00 + -8) = 0x10561d;
    lddmc_nodecount(MVar14);
    *(undefined8 *)(__ptr_00 + -8) = 0x10562e;
    printf("Initial states: %zu LDD nodes\n");
    if (0 < next_count) {
      uVar20 = 0;
      do {
        MVar14 = next[uVar20]->dd;
        *(undefined8 *)(__ptr_00 + -8) = 0x105654;
        sVar8 = lddmc_nodecount(MVar14);
        *(undefined8 *)(__ptr_00 + -8) = 0x105664;
        printf("Transition %d: %zu LDD nodes\n",uVar20 & 0xffffffff,sVar8);
        uVar20 = uVar20 + 1;
      } while ((long)uVar20 < (long)next_count);
    }
    if (verbose == '\x01') {
      *(undefined8 *)(__ptr_00 + -8) = 0x105688;
      puts("Preparing conversion to BDD...");
    }
  }
  prVar11 = (rel_t)(__ptr_00 + -((ulong)(uint)vector_size * 4 + 0xf & 0xfffffffffffffff0));
  if (0 < vector_size) {
    prVar11[-1].w_proj = (int *)0x1056b5;
    memset(prVar11,0,(ulong)(uint)vector_size << 2);
  }
  local_60 = *(FILE **)local_a8;
  local_70 = (undefined1  [8])compute_highest_WRAP;
  _len = (_Worker *)0x1;
  pFStack_58 = (FILE *)prVar11;
  prVar11[-1].w_proj = (int *)0x1056e2;
  lace_run_task((Task *)local_70);
  has_reachable = 0;
  if (0 < next_count) {
    lVar17 = 0;
    do {
      local_60 = (FILE *)next[lVar17]->dd;
      pFStack_58 = (FILE *)next[lVar17]->meta;
      local_70 = (undefined1  [8])compute_highest_action_WRAP;
      _len = (_Worker *)0x1;
      local_50 = &has_reachable;
      prVar11[-1].w_proj = (int *)0x10572e;
      lace_run_task((Task *)local_70);
      lVar17 = lVar17 + 1;
    } while (lVar17 < next_count);
  }
  uVar20 = (ulong)(uint)vector_size;
  __ptr_00 = (undefined1 *)((long)prVar11 - (uVar20 * 4 + 0xf & 0xfffffffffffffff0));
  if (0 < vector_size) {
    uVar19 = 0;
    do {
      uVar15 = *(uint *)((long)&prVar11->dd + uVar19 * 4);
      iVar10 = 0;
      if (uVar15 != 0) {
        uVar3 = 0x1f;
        if (uVar15 != 0) {
          for (; uVar15 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        iVar10 = 0x20 - (uVar3 ^ 0x1f);
        iVar16 = (uVar3 ^ 0x1f) - 0x20;
        do {
          uVar15 = uVar15 >> 1;
          iVar16 = iVar16 + 1;
        } while (iVar16 != 0);
        *(uint *)((long)&prVar11->dd + uVar19 * 4) = uVar15;
      }
      *(uint *)(__ptr_00 + uVar19 * 4) = iVar10 + (uint)(iVar10 == 0);
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar20);
  }
  iVar10 = has_reachable;
  actionbits = 0;
  if (has_reachable != 0) {
    uVar15 = 0x1f;
    if (has_reachable != 0) {
      for (; (uint)has_reachable >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    actionbits = 0x20 - (uVar15 ^ 0x1f);
    iVar16 = (uVar15 ^ 0x1f) - 0x20;
    do {
      has_reachable = (uint)has_reachable >> 1;
      iVar16 = iVar16 + 1;
    } while (iVar16 != 0);
  }
  if ((iVar10 == 0) && ((has_actions & 1) != 0)) {
    actionbits = 1;
  }
  if (verbose == '\x01') {
    *(undefined8 *)(__ptr_00 + -8) = 0x1057f5;
    printf("Bits per level: ");
    if (0 < vector_size) {
      lVar17 = 0;
      do {
        if (lVar17 != 0) {
          *(undefined8 *)(__ptr_00 + -8) = 0x10581e;
          printf(", ");
        }
        uVar15 = *(uint *)(__ptr_00 + lVar17 * 4);
        *(undefined8 *)(__ptr_00 + -8) = 0x10582c;
        printf("%d",(ulong)uVar15);
        lVar17 = lVar17 + 1;
      } while (lVar17 < vector_size);
    }
    *(undefined8 *)(__ptr_00 + -8) = 0x105845;
    putchar(10);
    *(undefined8 *)(__ptr_00 + -8) = 0x105859;
    printf("Action bits: %d.\n",(ulong)(uint)actionbits);
    uVar20 = (ulong)(uint)vector_size;
  }
  MVar14 = 1;
  if (0 < (int)uVar20) {
    iVar10 = 0;
    iVar16 = -1;
    do {
      uVar1 = *(uint32_t *)(__ptr_00 + (long)((int)uVar20 + iVar16) * 4);
      *(undefined8 *)(__ptr_00 + -8) = 0x105880;
      MVar14 = lddmc_makenode(uVar1,MVar14,0);
      iVar10 = iVar10 + 1;
      uVar20 = (ulong)(uint)vector_size;
      iVar16 = iVar16 + -1;
    } while (iVar10 < vector_size);
  }
  new_rel = MVar14;
  *(undefined8 *)(__ptr_00 + -8) = 0x1058ab;
  lddmc_ref(MVar14);
  if ((long)vector_size < 1) {
    local_b8 = 0x8000000000000000;
    iVar10 = 0;
  }
  else {
    lVar17 = 0;
    iVar10 = 0;
    do {
      iVar16 = iVar10;
      lVar18 = lVar17 * 4;
      iVar10 = *(int *)(__ptr_00 + lVar18) + iVar16;
      lVar17 = lVar17 + 1;
    } while (vector_size != lVar17);
    local_b8 = 0x8000000000000000;
    if (0 < iVar10) {
      iVar16 = *(int *)(__ptr_00 + lVar18) + iVar16;
      uVar1 = iVar16 * 2;
      do {
        MVar9 = local_b8;
        uVar1 = uVar1 - 2;
        if (local_b8 == 0) {
          local_b8 = 0;
        }
        else {
          *(undefined8 *)(__ptr_00 + -8) = 0x1058f7;
          local_b8 = _mtbdd_makenode(uVar1,0,MVar9);
        }
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
    }
  }
  *(undefined8 *)(__ptr_00 + -8) = 0x105926;
  mtbdd_protect(&local_b8);
  if (verbose != '\0') {
    *(undefined8 *)(__ptr_00 + -8) = 0x10593b;
    puts("Converting to BDD...");
  }
  *(undefined8 *)(__ptr_00 + -8) = 0x10594e;
  pFVar6 = fopen(bdd_filename,"w");
  if (pFVar6 != (FILE *)0x0) {
    *(undefined8 *)(__ptr_00 + -8) = 0x105973;
    fwrite(&vector_size,4,1,pFVar6);
    *(undefined8 *)(__ptr_00 + -8) = 0x10598a;
    fwrite(__ptr_00,4,(long)vector_size,pFVar6);
    *(undefined8 *)(__ptr_00 + -8) = 0x1059a3;
    fwrite(&actionbits,4,1,pFVar6);
    local_60 = *(FILE **)local_90;
    local_70 = (undefined1  [8])bdd_from_ldd_WRAP;
    _len = (_Worker *)0x1;
    pFStack_58 = (FILE *)new_rel;
    local_50 = (int *)((ulong)local_50 & 0xffffffff00000000);
    *(undefined8 *)(__ptr_00 + -8) = 0x1059e7;
    lace_run_task((Task *)local_70);
    pFVar5 = local_60;
    local_c8 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)local_60;
    local_d0 = (rel_t)(long)iVar10;
    local_70 = (undefined1  [8])mtbdd_satcount_WRAP;
    _len = (_Worker *)0x1;
    pFStack_58 = (FILE *)local_d0;
    *(undefined8 *)(__ptr_00 + -8) = 0x105a23;
    lace_run_task((Task *)local_70);
    uVar20 = (ulong)(double)local_60;
    dVar4 = (double)local_60 - 9.223372036854776e+18;
    local_60 = *(FILE **)local_90;
    local_70 = (undefined1  [8])lddmc_satcount_cached_WRAP;
    _len = (_Worker *)0x1;
    *(undefined8 *)(__ptr_00 + -8) = 0x105a74;
    lace_run_task((Task *)local_70);
    if (((long)uVar20 >> 0x3f & (long)dVar4 | uVar20) ==
        ((long)(double)local_60 >> 0x3f & (long)((double)local_60 - 9.223372036854776e+18) |
        (long)(double)local_60)) {
      *(undefined8 *)(__ptr_00 + -8) = 0x105aab;
      mtbdd_refs_push((MTBDD)pFVar5);
      local_e0._0_4_ = 0xffffffff;
      *(undefined8 *)(__ptr_00 + -8) = 0x105acd;
      fwrite(local_e0,4,1,pFVar6);
      local_70 = (undefined1  [8])mtbdd_writer_tobinary_WRAP;
      _len = (_Worker *)0x1;
      pFStack_58 = (FILE *)&local_c8;
      local_50._0_1_ = '\x01';
      local_50._1_1_ = '\0';
      local_50._2_1_ = '\0';
      local_50._3_1_ = '\0';
      local_60 = pFVar6;
      *(undefined8 *)(__ptr_00 + -8) = 0x105b02;
      lace_run_task((Task *)local_70);
      pFVar5 = local_a8;
      local_60 = *(FILE **)local_a8;
      local_70 = (undefined1  [8])bdd_from_ldd_WRAP;
      _len = (_Worker *)0x1;
      pFStack_58 = (FILE *)new_rel;
      local_50 = (int *)((ulong)local_50._4_4_ << 0x20);
      *(undefined8 *)(__ptr_00 + -8) = 0x105b3e;
      lace_run_task((Task *)local_70);
      mtbdd = local_60;
      local_e0 = (undefined1  [8])local_60;
      local_70 = (undefined1  [8])mtbdd_satcount_WRAP;
      _len = (_Worker *)0x1;
      pFStack_58 = (FILE *)local_d0;
      *(undefined8 *)(__ptr_00 + -8) = 0x105b6e;
      lace_run_task((Task *)local_70);
      uVar20 = (ulong)(double)local_60;
      dVar4 = (double)local_60 - 9.223372036854776e+18;
      local_60 = *(FILE **)pFVar5;
      local_70 = (undefined1  [8])lddmc_satcount_cached_WRAP;
      _len = (_Worker *)0x1;
      *(undefined8 *)(__ptr_00 + -8) = 0x105bb9;
      lace_run_task((Task *)local_70);
      if (((long)uVar20 >> 0x3f & (long)dVar4 | uVar20) !=
          ((long)(double)local_60 >> 0x3f & (long)((double)local_60 - 9.223372036854776e+18) |
          (long)(double)local_60)) {
        *(code **)(__ptr_00 + -8) = main;
        __assert_fail("(size_t)mtbdd_satcount(new_states, totalbits) == (size_t)lddmc_satcount_cached(states->dd)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/examples/ldd2bdd.c"
                      ,0x2b2,"void run_WORK(WorkerP *, Task *)");
      }
      *(undefined8 *)(__ptr_00 + -8) = 0x105bef;
      mtbdd_refs_push((MTBDD)mtbdd);
      if (verbose == '\x01') {
        local_70 = (undefined1  [8])local_c8;
        *(undefined8 *)(__ptr_00 + -8) = 0x105c0f;
        sVar8 = mtbdd_nodecount_more((MTBDD *)local_70,1);
        *(undefined8 *)(__ptr_00 + -8) = 0x105c20;
        printf("Initial states: %zu BDD nodes\n",sVar8);
        local_70 = (undefined1  [8])mtbdd;
        *(undefined8 *)(__ptr_00 + -8) = 0x105c31;
        sVar8 = mtbdd_nodecount_more((MTBDD *)local_70,1);
        *(undefined8 *)(__ptr_00 + -8) = 0x105c42;
        printf("Reachable states: %zu BDD nodes\n",sVar8);
      }
      local_90 = mtbdd;
      *(undefined8 *)(__ptr_00 + -8) = 0x105c62;
      fwrite(&next_count,4,1,pFVar6);
      MVar9 = new_rel;
      if (0 < next_count) {
        lVar17 = 0;
        do {
          prVar11 = next[lVar17];
          *(undefined8 *)(__ptr_00 + -8) = 0x105c9a;
          fwrite(&prVar11->r_k,4,1,pFVar6);
          prVar11 = next[lVar17];
          *(undefined8 *)(__ptr_00 + -8) = 0x105cbb;
          fwrite(&prVar11->w_k,4,1,pFVar6);
          piVar2 = next[lVar17]->r_proj;
          iVar10 = next[lVar17]->r_k;
          *(undefined8 *)(__ptr_00 + -8) = 0x105cdb;
          fwrite(piVar2,4,(long)iVar10,pFVar6);
          piVar2 = next[lVar17]->w_proj;
          iVar10 = next[lVar17]->w_k;
          *(undefined8 *)(__ptr_00 + -8) = 0x105cfb;
          fwrite(piVar2,4,(long)iVar10,pFVar6);
          lVar17 = lVar17 + 1;
        } while (lVar17 < next_count);
        if (0 < next_count) {
          uVar20 = 0;
          new_states = (MTBDD)pFVar6;
          do {
            local_60 = (FILE *)next[uVar20]->dd;
            local_48 = next[uVar20]->meta;
            local_70 = (undefined1  [8])bdd_from_ldd_rel_WRAP;
            _len = (_Worker *)0x1;
            local_50 = (int *)((ulong)local_50 & 0xffffffff00000000);
            pFStack_58 = (FILE *)MVar9;
            *(undefined8 *)(__ptr_00 + -8) = 0x105d64;
            lace_run_task((Task *)local_70);
            pFVar5 = local_60;
            local_a0 = (undefined1  [8])local_60;
            *(undefined8 *)(__ptr_00 + -8) = 0x105d74;
            mtbdd_refs_push((MTBDD)pFVar5);
            local_70 = (undefined1  [8])mtbdd_writer_tobinary_WRAP;
            _len = (_Worker *)0x1;
            pFStack_58 = (FILE *)local_a0;
            local_50 = (int *)CONCAT44(local_50._4_4_,1);
            local_60 = pFVar6;
            *(undefined8 *)(__ptr_00 + -8) = 0x105da5;
            lace_run_task((Task *)local_70);
            if (verbose == '\x01') {
              local_70 = local_a0;
              *(undefined8 *)(__ptr_00 + -8) = 0x105dc6;
              sVar8 = mtbdd_nodecount_more((MTBDD *)local_70,1);
              *(undefined8 *)(__ptr_00 + -8) = 0x105dda;
              printf("Transition %d: %zu BDD nodes\n",uVar20 & 0xffffffff,sVar8);
            }
            if (check_results == '\x01') {
              MVar14 = next[uVar20]->meta;
              *(undefined8 *)(__ptr_00 + -8) = 0x105e00;
              MVar9 = meta_to_bdd(MVar14,MVar9,0);
              *(undefined8 *)(__ptr_00 + -8) = 0x105e0e;
              mtbdd_refs_push(MVar9);
              local_70 = (undefined1  [8])sylvan_relnext_WRAP;
              _len = (_Worker *)0x1;
              local_60 = local_90;
              pFStack_58 = (FILE *)local_a0;
              local_48 = local_48 & 0xffffffff00000000;
              local_50 = (int *)MVar9;
              *(undefined8 *)(__ptr_00 + -8) = 0x105e4a;
              lace_run_task((Task *)local_70);
              pFVar6 = local_60;
              *(undefined8 *)(__ptr_00 + -8) = 0x105e56;
              mtbdd_refs_push((MTBDD)pFVar6);
              local_60 = *(FILE **)local_a8;
              pFStack_58 = (FILE *)next[uVar20]->dd;
              local_50 = (int *)next[uVar20]->meta;
              local_70 = (undefined1  [8])lddmc_relprod_WRAP;
              _len = (_Worker *)0x1;
              *(undefined8 *)(__ptr_00 + -8) = 0x105e93;
              lace_run_task((Task *)local_70);
              pFVar5 = local_60;
              *(undefined8 *)(__ptr_00 + -8) = 0x105e9f;
              lddmc_refs_push((MDD)pFVar5);
              MVar9 = new_rel;
              local_70 = (undefined1  [8])bdd_from_ldd_WRAP;
              _len = (_Worker *)0x1;
              pFStack_58 = (FILE *)new_rel;
              local_50 = (int *)((ulong)local_50 & 0xffffffff00000000);
              local_60 = pFVar5;
              *(undefined8 *)(__ptr_00 + -8) = 0x105ed0;
              lace_run_task((Task *)local_70);
              if (pFVar6 != local_60) goto LAB_0010604c;
              *(undefined8 *)(__ptr_00 + -8) = 0x105ee4;
              lddmc_refs_pop(1);
              *(undefined8 *)(__ptr_00 + -8) = 0x105eee;
              mtbdd_refs_pop(2);
              pFVar6 = (FILE *)new_states;
            }
            *(undefined8 *)(__ptr_00 + -8) = 0x105f09;
            mtbdd_refs_pop(1);
            uVar20 = uVar20 + 1;
          } while ((long)uVar20 < (long)next_count);
        }
      }
      if (no_reachable != '\0') {
        local_84 = 0;
      }
      *(undefined8 *)(__ptr_00 + -8) = 0x105f45;
      fwrite(&local_84,4,1,pFVar6);
      if (local_84 != 0) {
        local_a0._0_4_ = 0xffffffff;
        *(undefined8 *)(__ptr_00 + -8) = 0x105f69;
        fwrite(local_a0,4,1,pFVar6);
        local_70 = (undefined1  [8])mtbdd_writer_tobinary_WRAP;
        _len = (_Worker *)0x1;
        pFStack_58 = (FILE *)local_e0;
        local_50 = (int *)CONCAT44(local_50._4_4_,1);
        local_60 = pFVar6;
        *(undefined8 *)(__ptr_00 + -8) = 0x105f9a;
        lace_run_task((Task *)local_70);
      }
      *(undefined8 *)(__ptr_00 + -8) = 0x105fa4;
      mtbdd_refs_pop(1);
      *(undefined8 *)(__ptr_00 + -8) = 0x105fbd;
      fwrite(&local_80,4,1,pFVar6);
      MVar9 = state_vars;
      lVar17 = (long)(int)local_80;
      if (0 < lVar17) {
        lVar18 = 0;
        do {
          __s = *(char **)(MVar9 + lVar18 * 8);
          *(undefined8 *)(__ptr_00 + -8) = 0x105fdb;
          sVar7 = strlen(__s);
          local_70._0_4_ = (int)sVar7;
          *(undefined8 *)(__ptr_00 + -8) = 0x105ff4;
          fwrite(local_70,4,1,pFVar6);
          uVar20 = (ulong)local_70 & 0xffffffff;
          *(undefined8 *)(__ptr_00 + -8) = 0x106007;
          fwrite(__s,1,uVar20,pFVar6);
          lVar18 = lVar18 + 1;
        } while (lVar17 != lVar18);
      }
      *(undefined8 *)(__ptr_00 + -8) = 0x106017;
      fclose(pFVar6);
      *(undefined8 *)(__ptr_00 + -8) = 0x10602c;
      printf("Written file %s.\n",bdd_filename);
      return;
    }
    goto LAB_0010606f;
  }
  goto LAB_0010606a;
LAB_0010604c:
  *(undefined8 *)(__ptr_00 + -8) = 0x106051;
  run_CALL_cold_6();
  puVar12 = __ptr_00;
LAB_00106051:
  *(undefined8 *)(puVar12 + -8) = 0x106056;
  run_CALL_cold_9();
LAB_00106056:
  *(undefined8 *)(puVar12 + -8) = 0x10605b;
  run_CALL_cold_1();
LAB_0010605b:
  puVar13 = puVar12;
  *(undefined8 *)(puVar13 + -8) = 0x106060;
  run_CALL_cold_2();
LAB_00106060:
  *(undefined8 *)(puVar13 + -8) = 0x106065;
  run_CALL_cold_3();
  puVar12 = puVar13;
LAB_00106065:
  __ptr_00 = puVar12;
  *(undefined8 *)(__ptr_00 + -8) = 0x10606a;
  run_CALL_cold_8();
LAB_0010606a:
  *(undefined8 *)(__ptr_00 + -8) = 0x10606f;
  run_CALL_cold_7();
LAB_0010606f:
  *(undefined8 *)(__ptr_00 + -8) = 0x10608e;
  __assert_fail("(size_t)mtbdd_satcount(new_initial, totalbits) == (size_t)lddmc_satcount_cached(initial->dd)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/examples/ldd2bdd.c"
                ,0x2a8,"void run_WORK(WorkerP *, Task *)");
}

Assistant:

VOID_TASK_0(run)
{
    // Open file
    FILE *f = fopen(model_filename, "rb");
    if (f == NULL) Abort("Cannot open file '%s'!\n", model_filename);

    // Read integers per vector
    if (fread(&vector_size, sizeof(int), 1, f) != 1) Abort("Invalid input file!\n");

    // Read initial state
    if (verbose) printf("Loading initial state.\n");
    set_t initial = set_load(f);

    // Read number of transitions
    if (fread(&next_count, sizeof(int), 1, f) != 1) Abort("Invalid input file!\n");
    next = (rel_t*)malloc(sizeof(rel_t) * next_count);

    // Read transitions
    if (verbose) printf("Loading transition relations.\n");
    for (int i=0; i<next_count; i++) next[i] = rel_load_proj(f);
    for (int i=0; i<next_count; i++) rel_load(f, next[i]);

    // Read whether reachable states are stored
    int has_reachable = 0;
    if (fread(&has_reachable, sizeof(int), 1, f) != 1) Abort("Input file missing reachable states!\n");
    if (has_reachable == 0) Abort("Input file missing reachable states!\n");

    // Read reachable states
    if (verbose) printf("Loading reachable states.\n");
    set_t states = set_load(f);
    
    // Read number of action labels
    int action_labels_count = 0;
    if (fread(&action_labels_count, sizeof(int), 1, f) != 1) action_labels_count = 0;
    // ignore: Abort("Input file missing action label count!\n");

    // Read action labels
    char *action_labels[action_labels_count];
    for (int i=0; i<action_labels_count; i++) {
        uint32_t len;
        if (fread(&len, sizeof(uint32_t), 1, f) != 1) Abort("Invalid input file!\n");
        action_labels[i] = (char*)malloc(sizeof(char[len+1]));
        if (fread(action_labels[i], sizeof(char), len, f) != len) Abort("Invalid input file!\n");
        action_labels[i][len] = 0;
    }

    // Close file
    fclose(f);

    // Report that we have read the input file
    printf("Read file %s.\n", model_filename);

    // Report statistics
    if (verbose) {
        printf("%d integers per state, %d transition groups\n", vector_size, next_count);
        printf("LDD nodes:\n");
        printf("Initial states: %zu LDD nodes\n", lddmc_nodecount(initial->dd));
        for (int i=0; i<next_count; i++) {
            printf("Transition %d: %zu LDD nodes\n", i, lddmc_nodecount(next[i]->dd));
        }
    }

    // Report that we prepare BDD conversion
    if (verbose) printf("Preparing conversion to BDD...\n");

    // Compute highest value at each level (from reachable states)
    uint32_t highest[vector_size];
    for (int i=0; i<vector_size; i++) highest[i] = 0;
    compute_highest(states->dd, highest);

    // Compute highest action label value (from transition relations)
    uint32_t highest_action = 0;
    for (int i=0; i<next_count; i++) {
        compute_highest_action(next[i]->dd, next[i]->meta, &highest_action);
    }

    // Compute number of bits for each level
    int bits[vector_size];
    for (int i=0; i<vector_size; i++) {
        bits[i] = 0;
        while (highest[i] != 0) {
            bits[i]++;
            highest[i]>>=1;
        }
        if (bits[i] == 0) bits[i] = 1;
    }

    // Compute number of bits for action label
    actionbits = 0;
    while (highest_action != 0) {
        actionbits++;
        highest_action>>=1;
    }
    if (actionbits == 0 && has_actions) actionbits = 1;

    // Report number of bits
    if (verbose) {
        printf("Bits per level: ");
        for (int i=0; i<vector_size; i++) {
            if (i>0) printf(", ");
            printf("%d", bits[i]);
        }
        printf("\n");
        printf("Action bits: %d.\n", actionbits);
    }

    // Compute bits MDD
    MDD bits_dd = lddmc_true;
    for (int i=0; i<vector_size; i++) {
        bits_dd = lddmc_makenode(bits[vector_size-i-1], bits_dd, lddmc_false);
    }
    lddmc_ref(bits_dd);

    // Compute total number of bits
    int totalbits = 0;
    for (int i=0; i<vector_size; i++) {
        totalbits += bits[i];
    }

    // Compute state variables
    MTBDD state_vars = mtbdd_true;
    for (int i=0; i<totalbits; i++) {
        state_vars = mtbdd_makenode(2*(totalbits-i-1), mtbdd_false, state_vars);
    }
    mtbdd_protect(&state_vars);

    // Report that we begin the actual conversion
    if (verbose) printf("Converting to BDD...\n");

    // Create BDD file
    f = fopen(bdd_filename, "w");
    if (f == NULL) Abort("Cannot open file '%s'!\n", bdd_filename);

    // Write domain...
    fwrite(&vector_size, sizeof(int), 1, f);
    fwrite(bits, sizeof(int), vector_size, f);
    fwrite(&actionbits, sizeof(int), 1, f);

    // Write initial state...
    MTBDD new_initial = bdd_from_ldd(initial->dd, bits_dd, 0);
    assert((size_t)mtbdd_satcount(new_initial, totalbits) == (size_t)lddmc_satcount_cached(initial->dd));
    mtbdd_refs_push(new_initial);
    {
        int k = -1;
        fwrite(&k, sizeof(int), 1, f);
        mtbdd_writer_tobinary(f, &new_initial, 1);
    }

    // Custom operation that converts to BDD given number of bits for each level
    MTBDD new_states = bdd_from_ldd(states->dd, bits_dd, 0);
    assert((size_t)mtbdd_satcount(new_states, totalbits) == (size_t)lddmc_satcount_cached(states->dd));
    mtbdd_refs_push(new_states);

    // Report size of BDD
    if (verbose) {
        printf("Initial states: %zu BDD nodes\n", mtbdd_nodecount(new_initial));
        printf("Reachable states: %zu BDD nodes\n", mtbdd_nodecount(new_states));
    }

    // Write number of transitions
    fwrite(&next_count, sizeof(int), 1, f);

    // Write meta for each transition
    for (int i=0; i<next_count; i++) {
        fwrite(&next[i]->r_k, sizeof(int), 1, f);
        fwrite(&next[i]->w_k, sizeof(int), 1, f);
        fwrite(next[i]->r_proj, sizeof(int), next[i]->r_k, f);
        fwrite(next[i]->w_proj, sizeof(int), next[i]->w_k, f);
    }

    // Write BDD for each transition
    for (int i=0; i<next_count; i++) {
        // Compute new transition relation
        MTBDD new_rel = bdd_from_ldd_rel(next[i]->dd, bits_dd, 0, next[i]->meta);
        mtbdd_refs_push(new_rel);
        mtbdd_writer_tobinary(f, &new_rel, 1);

        // Report number of nodes
        if (verbose) printf("Transition %d: %zu BDD nodes\n", i, mtbdd_nodecount(new_rel));

        if (check_results) {
            // Compute new <variables> for the current transition relation
            MTBDD new_vars = meta_to_bdd(next[i]->meta, bits_dd, 0);
            mtbdd_refs_push(new_vars);

            // Test if the transition is correctly converted
            MTBDD test = sylvan_relnext(new_states, new_rel, new_vars);
            mtbdd_refs_push(test);
            MDD succ = lddmc_relprod(states->dd, next[i]->dd, next[i]->meta);
            lddmc_refs_push(succ);
            MTBDD test2 = bdd_from_ldd(succ, bits_dd, 0);
            if (test != test2) Abort("Conversion error!\n");
            lddmc_refs_pop(1);
            mtbdd_refs_pop(2);
        }

        mtbdd_refs_pop(1);
    }

    // Write reachable states
    if (no_reachable) has_reachable = 0;
    fwrite(&has_reachable, sizeof(int), 1, f);
    if (has_reachable) {
        int k = -1;
        fwrite(&k, sizeof(int), 1, f);
        mtbdd_writer_tobinary(f, &new_states, 1);
    }
    mtbdd_refs_pop(1);  // new_states

    // Write action labels
    fwrite(&action_labels_count, sizeof(int), 1, f);
    for (int i=0; i<action_labels_count; i++) {
        uint32_t len = strlen(action_labels[i]);
        fwrite(&len, sizeof(uint32_t), 1, f);
        fwrite(action_labels[i], sizeof(char), len, f);
    }

    // Close the file
    fclose(f);

    // Report to the user
    printf("Written file %s.\n", bdd_filename);
}